

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_blas3.c
# Opt level: O0

int sp_dgemm(char *transa,char *transb,int m,int n,int k,double alpha,SuperMatrix *A,double *b,
            int ldb,double beta,double *c,int ldc)

{
  int local_4c;
  int j;
  int incy;
  int incx;
  double beta_local;
  SuperMatrix *A_local;
  double alpha_local;
  int k_local;
  int n_local;
  int m_local;
  char *transb_local;
  char *transa_local;
  
  for (local_4c = 0; local_4c < n; local_4c = local_4c + 1) {
    sp_dgemv(transa,alpha,A,b + ldb * local_4c,1,beta,c + ldc * local_4c,1);
  }
  return 0;
}

Assistant:

int
sp_dgemm(char *transa, char *transb, int m, int n, int k, 
         double alpha, SuperMatrix *A, double *b, int ldb, 
         double beta, double *c, int ldc)
{
    int    incx = 1, incy = 1;
    int    j;

    for (j = 0; j < n; ++j) {
	sp_dgemv(transa, alpha, A, &b[ldb*j], incx, beta, &c[ldc*j], incy);
    }
    return 0;    
}